

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O1

QSslConfiguration __thiscall QHttpNetworkReply::sslConfiguration(QHttpNetworkReply *this)

{
  long lVar1;
  long in_RSI;
  
  lVar1 = *(long *)(*(long *)(in_RSI + 8) + 0x178);
  if ((((lVar1 != 0) && (*(int *)(lVar1 + 4) != 0)) &&
      (*(long *)(*(long *)(in_RSI + 8) + 0x180) != 0)) &&
     (lVar1 = QMetaObject::cast((QObject *)&QSslSocket::staticMetaObject), lVar1 != 0)) {
    QSslSocket::sslConfiguration((QSslSocket *)this);
    return (QSharedDataPointer<QSslConfigurationPrivate>)
           (QSharedDataPointer<QSslConfigurationPrivate>)this;
  }
  QSslConfiguration::QSslConfiguration((QSslConfiguration *)this);
  return (QSharedDataPointer<QSslConfigurationPrivate>)
         (QSharedDataPointer<QSslConfigurationPrivate>)this;
}

Assistant:

QSslConfiguration QHttpNetworkReply::sslConfiguration() const
{
    Q_D(const QHttpNetworkReply);

    if (!d->connectionChannel)
        return QSslConfiguration();

    QSslSocket *sslSocket = qobject_cast<QSslSocket*>(d->connectionChannel->socket);
    if (!sslSocket)
        return QSslConfiguration();

    return sslSocket->sslConfiguration();
}